

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O2

double CMOD(double *R,double *I)

{
  double dVar1;
  double dVar2;
  
  dVar1 = ABS(*R);
  dVar2 = ABS(*I);
  if (dVar2 <= dVar1) {
    if (dVar1 <= dVar2) {
      dVar2 = 1.4142135623730951;
    }
    else {
      dVar2 = SQRT((dVar2 / dVar1) * (dVar2 / dVar1) + 1.0);
    }
    dVar2 = dVar2 * dVar1;
  }
  else {
    dVar2 = SQRT((dVar1 / dVar2) * (dVar1 / dVar2) + 1.0) * dVar2;
  }
  return dVar2;
}

Assistant:

static double CMOD(double *R, double *I) {
	double cmod;
	double AR, AI,temp;
	AR = fabs(*R);
	AI = fabs(*I);

	if (AR < AI) {
		temp = AR / AI;
		cmod = AI * sqrt(1.0 + temp*temp);
		return cmod;
	}

	if (AR > AI) {
		temp = AI / AR;
		cmod = AR * sqrt(1.0 + temp*temp);
		return cmod;
	}

	cmod = AR * sqrt(2.0);

	return cmod;
}